

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjWeakRefLookupTable::remove_stale_undo_weak_ref
          (CVmObjWeakRefLookupTable *this,CVmUndoRecord *undo_rec)

{
  CVmObjGlobPage *pCVar1;
  int iVar2;
  CVmObjTable *in_RSI;
  lookuptab_undo_rec *rec;
  int forget_record;
  uint in_stack_ffffffffffffffe8;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = CVmObjTable::is_obj_deletable(in_RSI,(vm_val_t *)(ulong)in_stack_ffffffffffffffe8);
  if (iVar2 != 0) {
    vm_val_t::set_nil((vm_val_t *)&in_RSI->global_var_head_);
    iVar3 = 1;
  }
  if ((in_RSI->globals_ != (CVmObjGlobPage *)0x0) && (iVar3 != 0)) {
    pCVar1 = in_RSI->globals_;
    vm_val_t::set_nil((vm_val_t *)&pCVar1->used_);
    *(undefined4 *)&pCVar1->nxt_ = 0;
  }
  return;
}

Assistant:

void CVmObjWeakRefLookupTable::
   remove_stale_undo_weak_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    int forget_record;

    /* presume we won't want to forget the record */
    forget_record = FALSE;

    /* 
     *   if the old value in the undo record refers to an object, forget
     *   about it 
     */
    if (G_obj_table->is_obj_deletable(&undo_rec->oldval))
    {
        /* 
         *   the object is being deleted - since we only weakly reference
         *   our objects, we must forget about this object now; this also
         *   means we can forget about the record entirely, since there is
         *   no need to apply it in the future now that it doesn't do
         *   anything 
         */
        undo_rec->oldval.set_nil();
        forget_record = TRUE;
    }

    /* delete our extended record if we're forgetting the record */
    if (undo_rec->id.ptrval != 0 && forget_record)
    {
        lookuptab_undo_rec *rec;

        /* get our private record from the standard undo record */
        rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

        /* we don't care about the key value in this record any more */
        rec->key.set_nil();

        /* mark the record as forgotten */
        rec->action = LOOKUPTAB_UNDO_NULL;
    }
}